

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O0

int Aig_NodeRefLabel_rec(Aig_Man_t *p,Aig_Obj_t *pNode,uint LevelMin)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  int local_34;
  int Counter;
  Aig_Obj_t *pFanin;
  uint LevelMin_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  local_34 = 0;
  iVar1 = Aig_ObjIsCi(pNode);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pNode);
    pAVar2 = Aig_ObjFanin0(pNode);
    uVar3 = *(ulong *)&pAVar2->field_0x18 >> 6;
    *(ulong *)&pAVar2->field_0x18 =
         *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)uVar3 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
    if (((uVar3 & 0x3ffffff) == 0) &&
       ((LevelMin == 0 ||
        (LevelMin < ((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff))))) {
      local_34 = Aig_NodeRefLabel_rec(p,pAVar2,LevelMin);
    }
    iVar1 = Aig_ObjIsBuf(pNode);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigMffc.c"
                      ,0x83,"int Aig_NodeRefLabel_rec(Aig_Man_t *, Aig_Obj_t *, unsigned int)");
      }
      pAVar2 = Aig_ObjFanin1(pNode);
      uVar3 = *(ulong *)&pAVar2->field_0x18 >> 6;
      *(ulong *)&pAVar2->field_0x18 =
           *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)uVar3 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
      if (((uVar3 & 0x3ffffff) == 0) &&
         ((LevelMin == 0 ||
          (LevelMin < ((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff))))) {
        iVar1 = Aig_NodeRefLabel_rec(p,pAVar2,LevelMin);
        local_34 = iVar1 + local_34;
      }
      p_local._4_4_ = local_34 + 1;
    }
    else {
      p_local._4_4_ = local_34;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_NodeRefLabel_rec( Aig_Man_t * p, Aig_Obj_t * pNode, unsigned LevelMin )
{
    Aig_Obj_t * pFanin;
    int Counter = 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // consider the first fanin
    pFanin = Aig_ObjFanin0(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    if ( Aig_ObjIsBuf(pNode) )
        return Counter;
    assert( Aig_ObjIsNode(pNode) );
    // consider the second fanin
    pFanin = Aig_ObjFanin1(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    return Counter + 1;
}